

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  ushort uVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  ulong uVar4;
  ulong assign_00;
  
  iVar3 = mbedtls_mpi_grow(X,(ulong)Y->n);
  if (iVar3 == 0) {
    uVar4 = -(ulong)assign;
    assign_00 = (long)(uVar4 | assign) >> 0x3f;
    uVar1 = (ushort)((long)uVar4 >> 0x3f);
    X->s = X->s & ~uVar1 | Y->s & uVar1;
    mbedtls_mpi_core_cond_assign(X->p,Y->p,(ulong)Y->n,assign_00);
    uVar4 = (ulong)Y->n;
    uVar1 = X->n;
    if (Y->n < uVar1) {
      pmVar2 = X->p;
      do {
        pmVar2[uVar4] = pmVar2[uVar4] & ~assign_00;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return iVar3;
}

Assistant:

__declspec(noinline)
#endif
int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,
                                 const mbedtls_mpi *Y,
                                 unsigned char assign)
{
    int ret = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));

    {
        mbedtls_ct_condition_t do_assign = mbedtls_ct_bool(assign);

        X->s = (int) mbedtls_ct_uint_if(do_assign, Y->s, X->s);

        mbedtls_mpi_core_cond_assign(X->p, Y->p, Y->n, do_assign);

        mbedtls_ct_condition_t do_not_assign = mbedtls_ct_bool_not(do_assign);
        for (size_t i = Y->n; i < X->n; i++) {
            X->p[i] = mbedtls_ct_mpi_uint_if_else_0(do_not_assign, X->p[i]);
        }
    }

cleanup:
    return ret;
}